

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::fixup_pvrtc1_4_modulation_rgb
               (decoder_etc_block *pETC_Blocks,uint32_t *pPVRTC_endpoints,void *pDst_blocks,
               uint32_t num_blocks_x,uint32_t num_blocks_y)

{
  undefined2 uVar1;
  undefined2 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint *puVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  undefined4 in_register_00000084;
  uint *puVar28;
  ulong uVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  uint32_t packed;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  uint32_t packed_1;
  int iVar37;
  int iVar38;
  int ey;
  int iVar39;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  int iVar46;
  undefined1 auVar47 [16];
  int iVar48;
  int iVar51;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar77 [16];
  uint32_t *pE_rows [3];
  uint local_284;
  ulong local_280;
  ulong local_268;
  ulong local_260;
  uint local_258;
  ulong local_250;
  uint local_248;
  ulong local_240;
  ulong local_238;
  ulong local_228;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_208;
  uint local_204;
  uint local_200;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  int local_198 [4];
  ulong local_188;
  ulong local_180;
  int local_174;
  uint local_170;
  uint local_16c;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  undefined8 local_140;
  void *local_138;
  ulong local_130;
  uint local_124;
  uint local_120;
  uint local_11c;
  int local_118;
  int local_114;
  uint local_110;
  int local_10c;
  ulong local_108;
  decoder_etc_block *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  uint32_t *local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48 [3];
  uint uVar8;
  
  uVar16 = (ulong)num_blocks_x;
  local_138 = pDst_blocks;
  uVar44 = num_blocks_x - 1;
  local_11c = num_blocks_y - 1;
  uVar6 = 0x1f;
  if (uVar44 != 0) {
    for (; uVar44 >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) + 0x21;
  if (uVar44 == 0) {
    uVar6 = 0;
  }
  uVar30 = 0x1f;
  if (local_11c != 0) {
    for (; local_11c >> uVar30 == 0; uVar30 = uVar30 - 1) {
    }
  }
  uVar30 = (uVar30 ^ 0xffffffe0) + 0x21;
  if (local_11c == 0) {
    uVar30 = 0;
  }
  if (uVar6 < uVar30) {
    uVar30 = uVar6;
  }
  local_100 = pETC_Blocks;
  local_108 = (ulong)uVar30;
  local_174 = uVar30 * 2;
  local_140 = CONCAT44(in_register_00000084,num_blocks_y);
  if (0 < (int)num_blocks_y) {
    local_170 = ~(-1 << ((byte)(uVar30 * 2) & 0x1f));
    local_c8 = (ulong)num_blocks_y;
    uVar13 = 0;
    auVar76 = pmovsxbd(in_XMM13,0x3030303);
    auVar77 = pmovsxbd(in_XMM15,0x4040404);
    auVar72 = pmovsxbd(in_XMM10,0xd0d0d0d);
    local_148 = 0;
    local_b8 = uVar16;
    local_16c = uVar44;
    local_c0 = pPVRTC_endpoints;
    do {
      local_150 = uVar13;
      puVar15 = &local_218;
      puVar28 = &local_1d8;
      lVar41 = 0;
      do {
        uVar30 = (int)uVar13 + -1 + (int)lVar41 & local_11c;
        local_48[lVar41] = (long)(pPVRTC_endpoints + uVar30 * (int)uVar16);
        uVar6 = 0xffffffff;
        lVar31 = 0;
        do {
          uVar34 = (pPVRTC_endpoints + uVar30 * (int)uVar16)[uVar6 & uVar44];
          uVar40 = local_218;
          uVar8 = local_214;
          uVar26 = local_1d8;
          uVar7 = local_1d4;
          if (-1 < (short)uVar34) goto LAB_0013f9fc;
          *(uint *)((long)puVar28 + lVar31) =
               ((((uVar34 & 0x1e) >> 4) + (uVar34 >> 10 & 0x1f) +
                (uVar34 >> 5 & 0x1f) + (uVar34 & 0x1e)) * 0xff) / 0x1f;
          uVar26 = local_1d8;
          uVar7 = local_1d4;
          if (-1 < (int)uVar34) goto LAB_0013fad6;
          *(uint *)((long)puVar15 + lVar31) =
               (((uVar34 >> 0x10 & 0x1f) + (uVar34 >> 0x15 & 0x1f) + (uVar34 >> 0x1a & 0x1f)) * 0xff
               ) / 0x1f;
          uVar6 = uVar6 + 1;
          lVar31 = lVar31 + 0x10;
        } while (lVar31 != 0x30);
        lVar41 = lVar41 + 1;
        puVar28 = puVar28 + 1;
        puVar15 = puVar15 + 1;
      } while (lVar41 != 3);
      if (0 < (int)uVar16) {
        uVar1 = (&g_pvrtc_swizzle_table)[local_150 & 0xff];
        uVar2 = (&g_pvrtc_swizzle_table)[local_150 >> 8 & 0xffffff];
        local_124 = ((uint)local_150 >> ((byte)local_108 & 0x1f)) << ((byte)local_174 & 0x1f);
        local_120 = CONCAT22(uVar2,uVar1);
        local_a0 = local_48[0];
        local_a8 = local_48[1];
        local_b0 = local_48[2];
        local_168 = CONCAT44(local_168._4_4_,local_1b8);
        local_180 = CONCAT44(local_180._4_4_,local_1f8);
        local_284 = local_1b4;
        local_188 = CONCAT44(local_188._4_4_,local_1f4);
        local_228 = (ulong)local_1b0;
        local_240 = (ulong)local_1f0;
        local_50 = 0;
        local_f0 = (ulong)local_210;
        local_250 = (ulong)local_1c0;
        local_f8 = (ulong)local_1d0;
        uVar13 = (ulong)local_1c4;
        uVar36 = (ulong)local_1c8;
        uVar29 = (ulong)local_204;
        uVar35 = (ulong)local_200;
        uVar42 = (ulong)local_208;
        local_280 = (ulong)local_1d4;
        local_268 = (ulong)local_1d8;
        local_260 = (ulong)local_218;
        uVar20 = local_250;
        local_238 = (ulong)local_214;
        do {
          local_250 = uVar20;
          uVar43 = uVar42;
          uVar27 = uVar29;
          uVar21 = uVar36;
          uVar20 = uVar13;
          local_130 = local_250;
          local_d0 = uVar35;
          uVar44 = (uint)(ushort)(&g_pvrtc_swizzle_table)[local_50 & 0xff] * 2 |
                   (uint)(ushort)(&g_pvrtc_swizzle_table)[local_50 >> 8] << 0x11 |
                   CONCAT22(uVar2,uVar1);
          uVar6 = (uint)local_50;
          if ((uint)uVar16 != (uint)local_140) {
            if ((uint)local_140 < (uint)uVar16) {
              uVar44 = uVar44 & local_170 |
                       (uVar6 >> ((byte)local_108 & 0x1f)) << ((byte)local_174 & 0x1f);
            }
            else {
              uVar44 = uVar44 & local_170 | local_124;
            }
          }
          uVar16 = (ulong)((int)local_148 + uVar6);
          uVar36 = (ulong)uVar44;
          *(uint32_t *)((long)local_138 + uVar36 * 8 + 4) = pPVRTC_endpoints[uVar16];
          uVar44 = local_100[uVar16].field_0.m_uint32[0];
          iVar37 = (uint)(byte)g_pvrtc_5[uVar44 >> 0x13 & 0x1f] +
                   (uint)(byte)g_pvrtc_5[uVar44 >> 0xb & 0x1f] +
                   (uint)(byte)g_pvrtc_5[uVar44 >> 3 & 0x1f];
          uVar13 = (ulong)(uVar44 >> 0x19 & 0xfffffff0);
          local_198[0] = *(int *)(g_etc1_inten_tables48 + uVar13 + 8) + iVar37 * 0x10;
          local_198[1] = *(int *)(g_etc1_inten_tables48 + uVar13 + 4) + iVar37 * 0x10;
          local_198[2] = *(int *)(g_etc1_inten_tables48 + uVar13 + 4) + iVar37 * 0x10;
          local_198[3] = *(int *)(g_etc1_inten_tables48 + uVar13) + iVar37 * 0x10;
          uVar6 = uVar6 + 1;
          local_50 = (ulong)uVar6;
          uVar13 = (ulong)(uVar6 & local_16c);
          uVar44 = *(uint *)(local_48[0] + uVar13 * 4);
          uVar30 = (uint)uVar35;
          local_258 = (uint)local_f8;
          local_248 = (uint)local_f0;
          local_1d8 = (uint)uVar21;
          local_218 = (uint)uVar43;
          uVar7 = (uint)local_280;
          uVar26 = (uint)local_268;
          uVar8 = (uint)local_238;
          uVar40 = (uint)local_260;
          local_1d4 = (uint)uVar20;
          local_214 = (uint)uVar27;
          local_208 = local_218;
          local_204 = local_214;
          local_200 = uVar30;
          local_1c8 = local_1d8;
          local_1c4 = local_1d4;
          local_158 = uVar35;
          if (-1 < (short)uVar44) {
            local_1b8 = (uint)local_168;
            local_1f8 = (uint)local_180;
LAB_0013f973:
            local_1b4 = local_284;
            local_1f4 = (uint)local_188;
LAB_0013f98c:
            local_1c0 = (uint)local_250;
            local_1d0 = local_258;
            local_210 = local_248;
            local_1b0 = (uint)local_228;
            local_1f0 = (uint)local_240;
LAB_0013f9fc:
            local_1d4 = uVar7;
            local_1d8 = uVar26;
            local_214 = uVar8;
            local_218 = uVar40;
            __assert_fail("packed & 0x8000",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xceb,"uint32_t basist::get_opaque_endpoint_l0(uint32_t)");
          }
          uVar34 = (((uVar44 & 0x1e) >> 4) + (uVar44 >> 10 & 0x1f) +
                   (uVar44 >> 5 & 0x1f) + (uVar44 & 0x1e)) * 0xff;
          uVar32 = (ulong)uVar34 / 0x1f;
          local_1b8 = uVar34 / 0x1f;
          if (-1 < (int)uVar44) {
            local_1f8 = (uint)local_180;
            local_1b4 = local_284;
LAB_0013fa58:
            local_1f4 = (uint)local_188;
            local_1b0 = (uint)local_228;
LAB_0013fac1:
            local_1c0 = (uint)local_250;
            local_1d0 = local_258;
            local_210 = local_248;
            local_1f0 = (uint)local_240;
LAB_0013fad6:
            local_1d4 = uVar7;
            local_1d8 = uVar26;
            local_214 = uVar8;
            local_218 = uVar40;
            __assert_fail("packed & 0x8000",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xcfa,"uint32_t basist::get_opaque_endpoint_l1(uint32_t)");
          }
          uVar34 = ((uVar44 >> 0x10 & 0x1f) + (uVar44 >> 0x15 & 0x1f) + (uVar44 >> 0x1a & 0x1f)) *
                   0xff;
          uVar29 = (ulong)uVar34 / 0x1f;
          uVar44 = *(uint *)(local_48[1] + uVar13 * 4);
          local_1f8 = uVar34 / 0x1f;
          if (-1 < (short)uVar44) goto LAB_0013f973;
          uVar34 = (((uVar44 & 0x1e) >> 4) + (uVar44 >> 10 & 0x1f) +
                   (uVar44 >> 5 & 0x1f) + (uVar44 & 0x1e)) * 0xff;
          uVar42 = (ulong)uVar34 / 0x1f;
          local_1b4 = uVar34 / 0x1f;
          if (-1 < (int)uVar44) goto LAB_0013fa58;
          uVar34 = ((uVar44 >> 0x10 & 0x1f) + (uVar44 >> 0x15 & 0x1f) + (uVar44 >> 0x1a & 0x1f)) *
                   0xff;
          uVar22 = (ulong)uVar34 / 0x1f;
          uVar44 = *(uint *)(local_48[2] + uVar13 * 4);
          local_1f4 = uVar34 / 0x1f;
          if (-1 < (short)uVar44) goto LAB_0013f98c;
          local_188 = uVar36;
          uVar34 = (((uVar44 & 0x1e) >> 4) + (uVar44 >> 10 & 0x1f) +
                   (uVar44 >> 5 & 0x1f) + (uVar44 & 0x1e)) * 0xff;
          local_228 = (ulong)uVar34 / 0x1f;
          local_1b0 = uVar34 / 0x1f;
          if (-1 < (int)uVar44) goto LAB_0013fac1;
          uVar44 = ((uVar44 >> 0x10 & 0x1f) + (uVar44 >> 0x15 & 0x1f) + (uVar44 >> 0x1a & 0x1f)) *
                   0xff;
          local_240 = (ulong)uVar44 / 0x1f;
          local_158 = local_240;
          local_d8 = uVar29;
          local_168 = (ulong)(local_100[uVar16].field_0.m_bytes[4] & 0xfffffff0 |
                             (uint)(local_100[uVar16].field_0.m_bytes[6] >> 4));
          iVar37 = local_1d4 * 9;
          local_160 = uVar16;
          iVar46 = local_214 * 9;
          local_10c = local_1f4 * 3 + iVar46;
          local_114 = local_1b4 * 3;
          local_110 = (uint)local_250 * 3;
          iVar17 = iVar37 + local_1b0 + local_114 + local_110;
          uVar34 = uVar30 * 3;
          local_60 = (ulong)uVar34;
          iVar33 = uVar44 / 0x1f + uVar34 + local_10c;
          local_58 = local_228;
          iVar38 = (local_198[(byte)g_etc1_x_selector_unpack[local_168 + 0x300]] - iVar17) * -0x10;
          if (iVar17 <= iVar33) {
            iVar38 = (local_198[(byte)g_etc1_x_selector_unpack[local_168 + 0x300]] - iVar17) * 0x10;
          }
          uVar44 = iVar33 - iVar17;
          if (iVar33 < iVar17) {
            uVar44 = -(iVar33 - iVar17);
          }
          local_180 = (ulong)uVar44;
          iVar17 = local_1d4 + local_1d8;
          iVar33 = (local_214 + local_218) * 8;
          local_e0 = uVar32;
          uVar3 = iVar33 + iVar17 * -8;
          if (iVar33 < iVar17 * 8) {
            uVar3 = -(iVar33 + iVar17 * -8);
          }
          local_80 = (ulong)uVar3;
          local_68 = (ulong)((local_100[uVar16].field_0.m_bytes[4] & 0xf) << 4 |
                            local_100[uVar16].field_0.m_bytes[6] & 0xf);
          iVar9 = local_198[(byte)g_etc1_x_selector_unpack[local_68]] + iVar17 * -8;
          local_118 = iVar9 * -0x10;
          if (iVar17 * 8 <= iVar33) {
            local_118 = iVar9 * 0x10;
          }
          uVar4 = uVar7 * 3;
          local_78 = (ulong)uVar4;
          iVar33 = uVar26 + uVar4 + local_1d8 * 3 + iVar37;
          uVar5 = uVar8 * 3;
          local_70 = (ulong)uVar5;
          iVar17 = uVar40 + uVar5 + local_218 * 3 + iVar46;
          uVar14 = iVar17 - iVar33;
          if (iVar17 < iVar33) {
            uVar14 = -(iVar17 - iVar33);
          }
          local_98 = (ulong)uVar14;
          local_e8 = uVar42;
          uVar13 = (ulong)(local_100[uVar16].field_0.m_bytes[5] & 0xfffffff0 |
                          (uint)(local_100[uVar16].field_0.m_bytes[7] >> 4));
          iVar9 = (local_198[(byte)g_etc1_x_selector_unpack[uVar13 + 0x100]] - iVar33) * -0x10;
          if (iVar33 <= iVar17) {
            iVar9 = (local_198[(byte)g_etc1_x_selector_unpack[uVar13 + 0x100]] - iVar33) * 0x10;
          }
          iVar23 = uVar7 * 6 + (local_1d8 + uVar26) * 2 + local_1d4 * 6;
          iVar33 = uVar8 * 6 + (local_218 + uVar40) * 2 + local_214 * 6;
          local_160 = uVar22;
          iVar17 = iVar33 - iVar23;
          if (iVar33 < iVar23) {
            iVar17 = -(iVar33 - iVar23);
          }
          uVar16 = (ulong)((local_100[uVar16].field_0.m_bytes[5] & 0xf) << 4 |
                          local_100[uVar16].field_0.m_bytes[7] & 0xf);
          iVar48 = (local_198[(byte)g_etc1_x_selector_unpack[uVar16 + 0x100]] - iVar23) * -0x10;
          if (iVar23 <= iVar33) {
            iVar48 = (local_198[(byte)g_etc1_x_selector_unpack[uVar16 + 0x100]] - iVar23) * 0x10;
          }
          uVar10 = local_1d4 * 6 + local_1d8 * 6;
          local_88 = (ulong)uVar10;
          iVar23 = uVar10 + (uVar26 + uVar7) * 2;
          iVar24 = local_214 * 6 + local_218 * 6;
          iVar25 = iVar24 + (uVar40 + uVar8) * 2;
          iVar33 = iVar25 - iVar23;
          if (iVar25 < iVar23) {
            iVar33 = -(iVar25 - iVar23);
          }
          iVar51 = (local_198[(byte)g_etc1_x_selector_unpack[uVar13]] - iVar23) * -0x10;
          if (iVar23 <= iVar25) {
            iVar51 = (local_198[(byte)g_etc1_x_selector_unpack[uVar13]] - iVar23) * 0x10;
          }
          uVar11 = local_1d4 + uVar7;
          local_90 = (ulong)uVar11;
          iVar39 = local_1d8 + uVar26 + uVar11;
          iVar25 = local_214 + uVar8;
          iVar18 = (local_218 + uVar40 + iVar25) * 4;
          iVar23 = iVar18 + iVar39 * -4;
          if (iVar18 < iVar39 * 4) {
            iVar23 = -(iVar18 + iVar39 * -4);
          }
          iVar12 = local_198[(byte)g_etc1_x_selector_unpack[uVar16]] + iVar39 * -4;
          iVar56 = iVar12 * -0x10;
          if (iVar39 * 4 <= iVar18) {
            iVar56 = iVar12 * 0x10;
          }
          uVar40 = (uint)(iVar56 != iVar23 * 3 &&
                         SBORROW4(iVar56,iVar23 * 3) == iVar56 + iVar23 * -3 < 0);
          if (iVar56 != iVar23 * 8 && SBORROW4(iVar56,iVar23 * 8) == iVar56 + iVar23 * -8 < 0) {
            uVar40 = 2;
          }
          if (iVar23 * 0xd < iVar56) {
            uVar40 = 3;
          }
          uVar26 = (uint)(iVar51 != iVar33 * 3 &&
                         SBORROW4(iVar51,iVar33 * 3) == iVar51 + iVar33 * -3 < 0) << 2;
          if (iVar33 * 8 < iVar51) {
            uVar26 = 8;
          }
          if (iVar33 * 0xd < iVar51) {
            uVar26 = 0xc;
          }
          uVar19 = (uint)(iVar48 != iVar17 * 3 &&
                         SBORROW4(iVar48,iVar17 * 3) == iVar48 + iVar17 * -3 < 0) << 8;
          if (iVar48 != iVar17 * 8 && SBORROW4(iVar48,iVar17 * 8) == iVar48 + iVar17 * -8 < 0) {
            uVar19 = 0x200;
          }
          if (iVar17 * 0xd < iVar48) {
            uVar19 = 0x300;
          }
          uVar45 = (uint)((int)(uVar14 * 3) < iVar9) << 10;
          if (iVar9 != uVar14 * 8 && SBORROW4(iVar9,uVar14 * 8) == (int)(iVar9 + uVar14 * -8) < 0) {
            uVar45 = 0x800;
          }
          if ((int)(uVar14 * 0xd) < iVar9) {
            uVar45 = 0xc00;
          }
          uVar14 = (uint)((int)(uVar3 * 3) < local_118) << 4;
          if (local_118 != uVar3 * 8 &&
              SBORROW4(local_118,uVar3 * 8) == (int)(local_118 + uVar3 * -8) < 0) {
            uVar14 = 0x20;
          }
          if ((int)(uVar3 * 0xd) < local_118) {
            uVar14 = 0x30;
          }
          local_1c8 = (uint)uVar32;
          iVar17 = iVar37 + local_1c8 + local_114;
          local_284 = (uint)uVar42;
          iVar33 = iVar37 + uVar4 + local_258;
          auVar58._8_8_ = auVar77._8_8_ & 0xffffffff00000000 | (ulong)local_110;
          auVar58._0_8_ = auVar77._0_8_ & 0xffffffff | (ulong)(uVar11 * 6) << 0x20;
          iVar37 = local_1d4 * 0xc;
          auVar67._4_4_ = iVar37;
          auVar67._0_4_ = iVar37;
          auVar67._8_4_ = iVar37;
          auVar67._12_4_ = iVar37;
          local_204 = (uint)uVar22;
          local_208 = (uint)uVar29;
          iVar9 = iVar46 + uVar5 + local_248;
          auVar71._8_8_ = auVar77._8_8_ & 0xffffffff00000000 | (ulong)uVar34;
          auVar71._0_8_ = auVar77._0_8_ & 0xffffffff | (ulong)(uint)(iVar25 * 6) << 0x20;
          iVar46 = local_214 * 0xc;
          auVar60._4_4_ = iVar46;
          auVar60._0_4_ = iVar46;
          auVar60._8_4_ = iVar46;
          auVar60._12_4_ = iVar46;
          auVar63._0_4_ = uVar10 + local_1c8 * 2 + local_284 * 2;
          auVar63._4_4_ = iVar37 + local_1d8 * 4;
          auVar63._8_4_ = local_1d8 * 3 + iVar17;
          auVar63._12_4_ = auVar76._12_4_;
          auVar57._0_4_ = iVar24 + local_208 * 2 + local_204 * 2;
          auVar57._4_4_ = iVar46 + local_218 * 4;
          auVar57._8_4_ = local_218 * 3 + local_10c + local_208;
          auVar57._12_4_ = auVar76._12_4_;
          auVar68 = pblendw(auVar67,auVar58,0xfc);
          auVar69._0_4_ = auVar68._0_4_ + uVar7 * 4;
          auVar69._4_4_ = auVar68._4_4_ + (local_258 + (uint)local_250) * 2;
          auVar69._12_4_ = auVar68._12_4_;
          auVar69._8_4_ = auVar68._8_4_ + iVar33;
          auVar68._0_4_ = local_284 << 4;
          auVar68._4_4_ = local_1d8 << 5;
          auVar68._8_4_ = iVar17 * 8;
          auVar68._12_4_ = uVar11 * 8;
          auVar68 = pblendw(auVar68,auVar63,0x3f);
          auVar52._0_4_ = uVar7 << 6;
          auVar52._4_4_ = (local_258 + (uint)local_250) * 0x20;
          auVar52._8_4_ = iVar33 * 0x10;
          auVar52._12_4_ = local_1d4 << 4;
          auVar53 = pblendw(auVar52,auVar69,0x3f);
          auVar61 = pblendw(auVar60,auVar71,0xfc);
          auVar62._0_4_ = auVar61._0_4_ + uVar8 * 4;
          auVar62._4_4_ = auVar61._4_4_ + (local_248 + uVar30) * 2;
          auVar62._12_4_ = auVar61._12_4_;
          auVar62._8_4_ = auVar61._8_4_ + iVar9;
          auVar73._0_4_ = local_204 << 4;
          auVar73._4_4_ = local_218 << 5;
          auVar73._8_4_ = (local_10c + local_208) * 8;
          auVar73._12_4_ = iVar25 * 8;
          auVar74 = pblendw(auVar73,auVar57,0x3f);
          auVar64._0_4_ = uVar8 << 6;
          auVar64._4_4_ = (local_248 + uVar30) * 0x20;
          auVar64._8_4_ = iVar9 * 0x10;
          auVar64._12_4_ = local_214 << 4;
          auVar61 = pblendw(auVar64,auVar62,0x3f);
          iVar17 = auVar68._0_4_;
          iVar33 = auVar68._4_4_;
          iVar9 = auVar68._8_4_;
          iVar23 = auVar68._12_4_;
          iVar18 = auVar53._0_4_;
          iVar39 = auVar53._4_4_;
          iVar56 = auVar53._8_4_;
          iVar12 = auVar53._12_4_;
          uVar34 = (uint)(auVar74._0_4_ < iVar17);
          uVar7 = (uint)(auVar74._4_4_ < iVar33);
          uVar4 = (uint)(auVar74._8_4_ < iVar9);
          uVar10 = (uint)(auVar74._12_4_ < iVar23);
          uVar8 = (uint)(auVar61._0_4_ < iVar18);
          uVar3 = (uint)(auVar61._4_4_ < iVar39);
          uVar5 = (uint)(auVar61._8_4_ < iVar56);
          uVar11 = (uint)(auVar61._12_4_ < iVar12);
          auVar75._0_4_ = (auVar61._0_4_ - iVar18 ^ -uVar8) + uVar8;
          auVar75._4_4_ = (auVar61._4_4_ - iVar39 ^ -uVar3) + uVar3;
          auVar75._8_4_ = (auVar61._8_4_ - iVar56 ^ -uVar5) + uVar5;
          auVar75._12_4_ = (auVar61._12_4_ - iVar12 ^ -uVar11) + uVar11;
          auVar59._0_4_ = (auVar74._0_4_ - iVar17 ^ -uVar34) + uVar34;
          auVar59._4_4_ = (auVar74._4_4_ - iVar33 ^ -uVar7) + uVar7;
          auVar59._8_4_ = (auVar74._8_4_ - iVar9 ^ -uVar4) + uVar4;
          auVar59._12_4_ = (auVar74._12_4_ - iVar23 ^ -uVar10) + uVar10;
          iVar48 = ((local_198[(byte)g_etc1_x_selector_unpack[local_168]] - iVar17) * 0x10 ^ -uVar34
                   ) + uVar34;
          iVar24 = ((local_198[(byte)g_etc1_x_selector_unpack[local_68 + 0x100]] - iVar33) * 0x10 ^
                   -uVar7) + uVar7;
          iVar25 = ((local_198[(byte)g_etc1_x_selector_unpack[local_168 + 0x100]] - iVar9) * 0x10 ^
                   -uVar4) + uVar4;
          iVar51 = ((local_198[(byte)g_etc1_x_selector_unpack[uVar16 + 0x200]] - iVar23) * 0x10 ^
                   -uVar10) + uVar10;
          iVar17 = ((local_198[(byte)g_etc1_x_selector_unpack[uVar13 + 0x200]] - iVar18) * 0x10 ^
                   -uVar8) + uVar8;
          iVar33 = ((local_198[(byte)g_etc1_x_selector_unpack[uVar16 + 0x300]] - iVar39) * 0x10 ^
                   -uVar3) + uVar3;
          iVar9 = ((local_198[(byte)g_etc1_x_selector_unpack[uVar13 + 0x300]] - iVar56) * 0x10 ^
                  -uVar5) + uVar5;
          iVar23 = ((local_198[(byte)g_etc1_x_selector_unpack[local_68 + 0x200]] - iVar12) * 0x10 ^
                   -uVar11) + uVar11;
          auVar65._0_4_ = -(uint)(auVar75._0_4_ * 3 < iVar17);
          auVar65._4_4_ = -(uint)(auVar75._4_4_ * 3 < iVar33);
          auVar65._8_4_ = -(uint)(auVar75._8_4_ * 3 < iVar9);
          auVar65._12_4_ = -(uint)(auVar75._12_4_ * 3 < iVar23);
          auVar70._0_4_ = -(uint)(auVar59._0_4_ * 3 < iVar48);
          auVar70._4_4_ = -(uint)(auVar59._4_4_ * 3 < iVar24);
          auVar70._8_4_ = -(uint)(auVar59._8_4_ * 3 < iVar25);
          auVar70._12_4_ = -(uint)(auVar59._12_4_ * 3 < iVar51);
          auVar54._0_4_ = -(uint)(auVar59._0_4_ * 8 < iVar48);
          auVar54._4_4_ = -(uint)(auVar59._4_4_ * 8 < iVar24);
          auVar54._8_4_ = -(uint)(auVar59._8_4_ * 8 < iVar25);
          auVar54._12_4_ = -(uint)(auVar59._12_4_ * 8 < iVar51);
          auVar53._0_4_ = -(uint)(auVar75._0_4_ * 8 < iVar17);
          auVar53._4_4_ = -(uint)(auVar75._4_4_ * 8 < iVar33);
          auVar53._8_4_ = -(uint)(auVar75._8_4_ * 8 < iVar9);
          auVar53._12_4_ = -(uint)(auVar75._12_4_ * 8 < iVar23);
          auVar53 = blendvps(auVar65 & _DAT_0027d690,_DAT_0027d6a0,auVar53);
          auVar61 = blendvps(auVar70 & _DAT_0027d680,_DAT_0027d6b0,auVar54);
          auVar68 = pmulld(auVar59,auVar72);
          auVar74 = pmulld(auVar75,auVar72);
          auVar66._0_4_ = -(uint)(auVar74._0_4_ < iVar17);
          auVar66._4_4_ = -(uint)(auVar74._4_4_ < iVar33);
          auVar66._8_4_ = -(uint)(auVar74._8_4_ < iVar9);
          auVar66._12_4_ = -(uint)(auVar74._12_4_ < iVar23);
          auVar49._0_4_ = -(uint)(auVar68._0_4_ < iVar48);
          auVar49._4_4_ = -(uint)(auVar68._4_4_ < iVar24);
          auVar49._8_4_ = -(uint)(auVar68._8_4_ < iVar25);
          auVar49._12_4_ = -(uint)(auVar68._12_4_ < iVar51);
          auVar74 = blendvps(auVar61,_DAT_0027d6d0,auVar49);
          auVar66 = blendvps(auVar53,_DAT_0027d6e0,auVar66);
          iVar33 = iVar37 + local_284 * 4;
          iVar37 = iVar37 + (uint)local_250 * 4;
          iVar17 = iVar46 + local_204 * 4;
          iVar46 = iVar46 + uVar30 * 4;
          uVar34 = (uint)(iVar17 < iVar33);
          uVar8 = (uint)(iVar46 < iVar37);
          uVar16 = CONCAT44(iVar46 - iVar37,iVar17 - iVar33) ^ CONCAT44(-uVar8,-uVar34);
          auVar55._0_4_ = (int)uVar16 + uVar34;
          auVar55._4_4_ = (int)(uVar16 >> 0x20) + uVar8;
          auVar55._8_8_ = 0;
          uVar16 = CONCAT44((local_198[(byte)g_etc1_x_selector_unpack[local_68 + 0x300]] - iVar37) *
                            0x10,(local_198[(byte)g_etc1_x_selector_unpack[local_168 + 0x200]] -
                                 iVar33) * 0x10) ^ CONCAT44(-uVar8,-uVar34);
          iVar37 = (int)uVar16 + uVar34;
          iVar46 = (int)(uVar16 >> 0x20) + uVar8;
          auVar50._0_4_ = -(uint)(auVar55._0_4_ * 3 < iVar37);
          auVar50._4_4_ = -(uint)(auVar55._4_4_ * 3 < iVar46);
          auVar50._8_8_ = 0;
          auVar61._0_4_ = -(uint)(auVar55._0_4_ * 8 < iVar37);
          auVar61._4_4_ = -(uint)(auVar55._4_4_ * 8 < iVar46);
          auVar61._8_8_ = 0;
          auVar68 = blendvps(auVar50 & _DAT_0027d6f0,_DAT_0027d700,auVar61);
          auVar66 = auVar66 | auVar74;
          auVar53 = pmulld(auVar55,_DAT_0027d710);
          auVar47._0_4_ = -(uint)(auVar53._0_4_ < iVar37);
          auVar47._4_4_ = -(uint)(auVar53._4_4_ < iVar46);
          auVar47._8_4_ = -(uint)(auVar53._8_4_ < 0);
          auVar47._12_4_ = -(uint)(auVar53._12_4_ < 0);
          auVar68 = blendvps(auVar68,_DAT_0027d720,auVar47);
          auVar74._0_8_ = auVar66._8_8_;
          auVar74._8_4_ = auVar66._8_4_;
          auVar74._12_4_ = auVar66._12_4_;
          uVar34 = (uint)((int)(uVar44 * 3) < iVar38) << 0x1e;
          if (iVar38 != uVar44 * 8 && SBORROW4(iVar38,uVar44 * 8) == (int)(iVar38 + uVar44 * -8) < 0
             ) {
            uVar34 = 0x80000000;
          }
          if ((int)(uVar44 * 0xd) < iVar38) {
            uVar34 = 0xc0000000;
          }
          *(uint *)((long)local_138 + uVar36 * 8) =
               auVar68._4_4_ | auVar68._0_4_ | uVar14 | uVar45 | uVar19 | uVar40 | uVar26 | uVar34 |
               SUB164(auVar74 | auVar66,4) | SUB164(auVar74 | auVar66,0);
          local_1c0 = (uint)local_228;
          local_f0 = uVar35;
          local_f8 = local_250;
          local_200 = (uint)local_240;
          local_180 = uVar29;
          uVar13 = local_e8;
          uVar36 = local_e0;
          pPVRTC_endpoints = local_c0;
          uVar29 = local_160;
          uVar35 = local_158;
          uVar16 = local_b8;
          uVar42 = local_d8;
          local_280 = uVar20;
          local_268 = uVar21;
          local_260 = uVar43;
          uVar20 = local_228;
          local_238 = uVar27;
          local_188 = uVar22;
          local_168 = uVar32;
        } while ((uint)local_b8 != uVar6);
        local_148 = (ulong)((int)local_148 + uVar6);
        uVar44 = local_16c;
        local_210 = uVar30;
        local_1f8 = local_208;
        local_1f4 = local_204;
        local_1f0 = local_200;
        local_1d0 = (uint)local_250;
        local_1c4 = local_284;
        local_1b8 = local_1c8;
        local_1b4 = local_284;
        local_1b0 = local_1c0;
      }
      uVar13 = local_150 + 1;
    } while (uVar13 != local_c8);
  }
  return;
}

Assistant:

static void fixup_pvrtc1_4_modulation_rgb(const decoder_etc_block* pETC_Blocks, const uint32_t* pPVRTC_endpoints, void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y)
	{
		const uint32_t x_mask = num_blocks_x - 1;
		const uint32_t y_mask = num_blocks_y - 1;
		const uint32_t x_bits = basisu::total_bits(x_mask);
		const uint32_t y_bits = basisu::total_bits(y_mask);
		const uint32_t min_bits = basisu::minimum(x_bits, y_bits);
		//const uint32_t max_bits = basisu::maximum(x_bits, y_bits);
		const uint32_t swizzle_mask = (1 << (min_bits * 2)) - 1;

		uint32_t block_index = 0;

		// really 3x3
		int e0[4][4], e1[4][4];

		for (int y = 0; y < static_cast<int>(num_blocks_y); y++)
		{
			const uint32_t* pE_rows[3];

			for (int ey = 0; ey < 3; ey++)
			{
				int by = y + ey - 1; 

				const uint32_t* pE = &pPVRTC_endpoints[(by & y_mask) * num_blocks_x];

				pE_rows[ey] = pE;

				for (int ex = 0; ex < 3; ex++)
				{
					int bx = 0 + ex - 1; 

					const uint32_t e = pE[bx & x_mask];

					e0[ex][ey] = (get_opaque_endpoint_l0(e) * 255) / 31;
					e1[ex][ey] = (get_opaque_endpoint_l1(e) * 255) / 31;
				}
			}

			const uint32_t y_swizzle = (g_pvrtc_swizzle_table[y >> 8] << 16) | g_pvrtc_swizzle_table[y & 0xFF];

			for (int x = 0; x < static_cast<int>(num_blocks_x); x++, block_index++)
			{
				const decoder_etc_block& src_block = pETC_Blocks[block_index];

				const uint32_t x_swizzle = (g_pvrtc_swizzle_table[x >> 8] << 17) | (g_pvrtc_swizzle_table[x & 0xFF] << 1);

				uint32_t swizzled = x_swizzle | y_swizzle;
				if (num_blocks_x != num_blocks_y)
				{
					swizzled &= swizzle_mask;

					if (num_blocks_x > num_blocks_y)
						swizzled |= ((x >> min_bits) << (min_bits * 2));
					else
						swizzled |= ((y >> min_bits) << (min_bits * 2));
				}

				pvrtc4_block* pDst_block = static_cast<pvrtc4_block*>(pDst_blocks) + swizzled;
				pDst_block->m_endpoints = pPVRTC_endpoints[block_index];

				uint32_t base_r = g_etc_5_to_8[src_block.m_differential.m_red1];
				uint32_t base_g = g_etc_5_to_8[src_block.m_differential.m_green1];
				uint32_t base_b = g_etc_5_to_8[src_block.m_differential.m_blue1];

				const int* pInten_table48 = g_etc1_inten_tables48[src_block.m_differential.m_cw1];
				int by = (base_r + base_g + base_b) * 16;
				int block_colors_y_x16[4];
				block_colors_y_x16[0] = by + pInten_table48[2];
				block_colors_y_x16[1] = by + pInten_table48[3];
				block_colors_y_x16[2] = by + pInten_table48[1];
				block_colors_y_x16[3] = by + pInten_table48[0];

				{
					const uint32_t ex = 2;
					int bx = x + ex - 1;
					bx &= x_mask;

#define DO_ROW(ey) \
					{ \
						const uint32_t e = pE_rows[ey][bx]; \
						e0[ex][ey] = (get_opaque_endpoint_l0(e) * 255) / 31; \
						e1[ex][ey] = (get_opaque_endpoint_l1(e) * 255) / 31; \
					}

					DO_ROW(0);
					DO_ROW(1);
					DO_ROW(2);
#undef DO_ROW
				}

				uint32_t mod = 0;

				uint32_t lookup_x[4];

#define DO_LOOKUP(lx) { \
					const uint32_t byte_ofs = 7 - (((lx) * 4) >> 3); \
					const uint32_t lsb_bits = src_block.m_bytes[byte_ofs] >> (((lx) & 1) * 4); \
					const uint32_t msb_bits = src_block.m_bytes[byte_ofs - 2] >> (((lx) & 1) * 4); \
					lookup_x[lx] = (lsb_bits & 0xF) | ((msb_bits & 0xF) << 4); }

				DO_LOOKUP(0);
				DO_LOOKUP(1);
				DO_LOOKUP(2);
				DO_LOOKUP(3);
#undef DO_LOOKUP

#define DO_PIX(lx, ly, w0, w1, w2, w3) \
				{ \
					int ca_l = a0 * w0 + a1 * w1 + a2 * w2 + a3 * w3; \
					int cb_l = b0 * w0 + b1 * w1 + b2 * w2 + b3 * w3; \
					int cl = block_colors_y_x16[g_etc1_x_selector_unpack[ly][lookup_x[lx]]]; \
					int dl = cb_l - ca_l; \
					int vl = cl - ca_l; \
					int p = vl * 16; \
					if (ca_l > cb_l) { p = -p; dl = -dl; } \
					uint32_t m = 0; \
					if (p > 3 * dl) m = (uint32_t)(1 << ((ly) * 8 + (lx) * 2)); \
					if (p > 8 * dl) m = (uint32_t)(2 << ((ly) * 8 + (lx) * 2)); \
					if (p > 13 * dl) m = (uint32_t)(3 << ((ly) * 8 + (lx) * 2)); \
					mod |= m; \
				}

				{
					const uint32_t ex = 0, ey = 0;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(0, 0, 4, 4, 4, 4);
					DO_PIX(1, 0, 2, 6, 2, 6);
					DO_PIX(0, 1, 2, 2, 6, 6);
					DO_PIX(1, 1, 1, 3, 3, 9);
				}

				{
					const uint32_t ex = 1, ey = 0;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(2, 0, 8, 0, 8, 0);
					DO_PIX(3, 0, 6, 2, 6, 2);
					DO_PIX(2, 1, 4, 0, 12, 0);
					DO_PIX(3, 1, 3, 1, 9, 3);
				}

				{
					const uint32_t ex = 0, ey = 1;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(0, 2, 8, 8, 0, 0);
					DO_PIX(1, 2, 4, 12, 0, 0);
					DO_PIX(0, 3, 6, 6, 2, 2);
					DO_PIX(1, 3, 3, 9, 1, 3);
				}

				{
					const uint32_t ex = 1, ey = 1;
					const int a0 = e0[ex][ey], a1 = e0[ex + 1][ey], a2 = e0[ex][ey + 1], a3 = e0[ex + 1][ey + 1];
					const int b0 = e1[ex][ey], b1 = e1[ex + 1][ey], b2 = e1[ex][ey + 1], b3 = e1[ex + 1][ey + 1];
					DO_PIX(2, 2, 16, 0, 0, 0);
					DO_PIX(3, 2, 12, 4, 0, 0);
					DO_PIX(2, 3, 12, 0, 4, 0);
					DO_PIX(3, 3, 9, 3, 3, 1);
				}
#undef DO_PIX

				pDst_block->m_modulation = mod;

				e0[0][0] = e0[1][0]; e0[1][0] = e0[2][0];
				e0[0][1] = e0[1][1]; e0[1][1] = e0[2][1];
				e0[0][2] = e0[1][2]; e0[1][2] = e0[2][2];

				e1[0][0] = e1[1][0]; e1[1][0] = e1[2][0];
				e1[0][1] = e1[1][1]; e1[1][1] = e1[2][1];
				e1[0][2] = e1[1][2]; e1[1][2] = e1[2][2];

			} // x
		} // y
	}